

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O2

void __thiscall swrenderer::Stat_fps_accumulated::Stat_fps_accumulated(Stat_fps_accumulated *this)

{
  FStat::FStat(&this->super_FStat,"fps_accumulated");
  (this->super_FStat)._vptr_FStat = (_func_int **)&PTR__FStat_006e6128;
  return;
}

Assistant:

ADD_STAT (fps_accumulated)
{
	f_acc += FrameCycles.TimeMS();
	w_acc += WallCycles.TimeMS();
	p_acc += PlaneCycles.TimeMS();
	m_acc += MaskedCycles.TimeMS();
	acc_c++;
	FString out;
	out.Format("frame=%04.1f ms  walls=%04.1f ms  planes=%04.1f ms  masked=%04.1f ms  %d counts",
		f_acc/acc_c, w_acc/acc_c, p_acc/acc_c, m_acc/acc_c, acc_c);
	Printf(PRINT_LOG, "%s\n", out.GetChars());
	return out;
}